

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint8_t * svb_encode_scalar_d1_init
                    (uint32_t *in,uint8_t *keyPtr,uint8_t *dataPtr,uint32_t count,uint32_t prev)

{
  uint8_t uVar1;
  uint32_t val_00;
  uint in_ECX;
  uint8_t *in_RDX;
  byte *in_RSI;
  long in_RDI;
  int in_R8D;
  uint8_t code;
  uint32_t val;
  uint32_t c;
  uint8_t key;
  uint8_t shift;
  uint local_30;
  byte local_2a;
  byte local_29;
  int local_28;
  uint8_t *local_20;
  byte *local_18;
  long local_10;
  uint8_t *local_8;
  
  local_8 = in_RDX;
  if (in_ECX != 0) {
    local_29 = 0;
    local_2a = 0;
    local_28 = in_R8D;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
      if (local_29 == 8) {
        local_29 = 0;
        *local_18 = local_2a;
        local_2a = 0;
        local_18 = local_18 + 1;
      }
      val_00 = *(int *)(local_10 + (ulong)local_30 * 4) - local_28;
      local_28 = *(int *)(local_10 + (ulong)local_30 * 4);
      uVar1 = _encode_data(val_00,&local_20);
      local_2a = local_2a | uVar1 << (local_29 & 0x1f);
      local_29 = local_29 + 2;
    }
    *local_18 = local_2a;
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

uint8_t *svb_encode_scalar_d1_init(const uint32_t *in,
                                   uint8_t *__restrict__ keyPtr,
                                   uint8_t *__restrict__ dataPtr,
                                   uint32_t count, uint32_t prev) {
  if (count == 0)
    return dataPtr; // exit immediately if no data

  uint8_t shift = 0; // cycles 0, 2, 4, 6, 0, 2, 4, 6, ...
  uint8_t key = 0;
  for (uint32_t c = 0; c < count; c++) {
    if (shift == 8) {
      shift = 0;
      *keyPtr++ = key;
      key = 0;
    }
    uint32_t val = in[c] - prev;
    prev = in[c];
    uint8_t code = _encode_data(val, &dataPtr);
    key |= code << shift;
    shift += 2;
  }

  *keyPtr = key;  // write last key (no increment needed)
  return dataPtr; // pointer to first unused data byte
}